

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_Browse(UA_Server *server,UA_Session *session,UA_BrowseRequest *request,
                   UA_BrowseResponse *response)

{
  UA_Boolean UVar1;
  UA_BrowseResult *pUVar2;
  UA_StatusCode UVar3;
  long lVar4;
  size_t __nmemb;
  long lVar5;
  
  UVar1 = UA_NodeId_isNull(&(request->view).viewId);
  UVar3 = 0x806b0000;
  if (UVar1) {
    __nmemb = request->nodesToBrowseSize;
    if (__nmemb == 0) {
      UVar3 = 0x800f0000;
    }
    else {
      pUVar2 = (UA_BrowseResult *)calloc(__nmemb,0x28);
      response->results = pUVar2;
      if (pUVar2 != (UA_BrowseResult *)0x0) {
        response->resultsSize = __nmemb;
        lVar5 = 0;
        lVar4 = 0;
        do {
          Service_Browse_single
                    (server,session,(ContinuationPointEntry *)0x0,
                     (UA_BrowseDescription *)
                     ((long)&(request->nodesToBrowse->nodeId).namespaceIndex + lVar5),
                     request->requestedMaxReferencesPerNode,
                     (UA_BrowseResult *)((long)&response->results->statusCode + lVar4));
          lVar4 = lVar4 + 0x28;
          lVar5 = lVar5 + 0x48;
          __nmemb = __nmemb - 1;
        } while (__nmemb != 0);
        return;
      }
      UVar3 = 0x80030000;
    }
  }
  (response->responseHeader).serviceResult = UVar3;
  return;
}

Assistant:

void Service_Browse(UA_Server *server, UA_Session *session, const UA_BrowseRequest *request,
                    UA_BrowseResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing BrowseRequest");
    if(!UA_NodeId_isNull(&request->view.viewId)) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADVIEWIDUNKNOWN;
        return;
    }

    if(request->nodesToBrowseSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    size_t size = request->nodesToBrowseSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_BROWSERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = size;

#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
#ifdef NO_ALLOCA
    UA_Boolean isExternal[size];
    UA_UInt32 indices[size];
#else
    UA_Boolean *isExternal = UA_alloca(sizeof(UA_Boolean) * size);
    UA_UInt32 *indices = UA_alloca(sizeof(UA_UInt32) * size);
#endif /*NO_ALLOCA */
    memset(isExternal, false, sizeof(UA_Boolean) * size);
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        size_t indexSize = 0;
        for(size_t i = 0; i < size; ++i) {
            if(request->nodesToBrowse[i].nodeId.namespaceIndex != server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->browseNodes(ens->ensHandle, &request->requestHeader, request->nodesToBrowse, indices,
                         (UA_UInt32)indexSize, request->requestedMaxReferencesPerNode,
                         response->results, response->diagnosticInfos);
    }
#endif

    for(size_t i = 0; i < size; ++i) {
#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
        if(!isExternal[i])
#endif
            Service_Browse_single(server, session, NULL, &request->nodesToBrowse[i],
                                  request->requestedMaxReferencesPerNode, &response->results[i]);
    }
}